

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1d_cbs.c
# Opt level: O3

RK_S32 mpp_av1_global_motion_params(AV1Context *ctx,BitReadCtx_t *gb,AV1RawFrameHeader *current)

{
  int iVar1;
  char cVar2;
  RK_S32 RVar3;
  AV1RawFrameHeader *pAVar4;
  int type;
  int iVar5;
  RK_S32 idx;
  long lVar6;
  long lVar7;
  RK_U32 value_2;
  RK_U32 value_1;
  RK_U32 value;
  char local_44 [4];
  char local_40 [4];
  char local_3c [4];
  long local_38;
  
  if ((gb->field_0xc & 0xfd) != 0) {
    iVar1 = 1;
    lVar7 = 0x2a5;
    lVar6 = 0x2d8;
    do {
      RVar3 = mpp_av1_read_unsigned(&ctx->gb,1,"is_global[ref]",(RK_U32 *)local_3c,0,1);
      if (RVar3 < 0) {
        return -1;
      }
      *(char *)((long)gb + lVar7 + -0x10) = local_3c[0];
      if (local_3c[0] != '\0') {
        idx = 1;
        RVar3 = mpp_av1_read_unsigned(&ctx->gb,1,"is_rot_zoom[ref]",(RK_U32 *)local_40,0,1);
        cVar2 = local_40[0];
        if (RVar3 < 0) {
          return -1;
        }
        *(char *)((long)gb + lVar7 + -8) = local_40[0];
        pAVar4 = (AV1RawFrameHeader *)0x2;
        if (local_40[0] == '\0') {
          idx = 1;
          RVar3 = mpp_av1_read_unsigned(&ctx->gb,1,"is_translation[ref]",(RK_U32 *)local_44,0,1);
          if (RVar3 < 0) {
            return -1;
          }
          *(char *)((long)&gb->data_ + lVar7) = local_44[0];
          if (local_44[0] == '\0') {
            pAVar4 = (AV1RawFrameHeader *)0x3;
            goto LAB_001c476a;
          }
          iVar5 = (int)lVar7 + -0x2a4;
          pAVar4 = (AV1RawFrameHeader *)0x1;
        }
        else {
LAB_001c476a:
          type = (int)lVar7 + -0x2a4;
          local_38 = lVar7;
          RVar3 = mpp_av1_global_motion_param(ctx,gb,pAVar4,type,2,idx);
          if (RVar3 < 0) {
            return -1;
          }
          RVar3 = mpp_av1_global_motion_param(ctx,gb,pAVar4,type,3,idx);
          if (RVar3 < 0) {
            return -1;
          }
          iVar5 = iVar1;
          if (cVar2 == '\0') {
            RVar3 = mpp_av1_global_motion_param(ctx,gb,(AV1RawFrameHeader *)0x3,type,4,idx);
            lVar7 = local_38;
            if (RVar3 < 0) {
              return -1;
            }
            RVar3 = mpp_av1_global_motion_param(ctx,gb,(AV1RawFrameHeader *)0x3,type,5,idx);
            pAVar4 = (AV1RawFrameHeader *)0x3;
            if (RVar3 < 0) {
              return -1;
            }
          }
          else {
            *(int *)((long)gb + lVar6 + -4) = -*(int *)((long)gb + lVar6 + -8);
            *(undefined4 *)((long)&gb->data_ + lVar6) = *(undefined4 *)((long)gb + lVar6 + -0xc);
            pAVar4 = (AV1RawFrameHeader *)0x2;
            lVar7 = local_38;
          }
        }
        RVar3 = mpp_av1_global_motion_param(ctx,gb,pAVar4,iVar5,0,idx);
        if (RVar3 < 0) {
          return -1;
        }
        RVar3 = mpp_av1_global_motion_param(ctx,gb,pAVar4,iVar5,1,idx);
        if (RVar3 < 0) {
          return -1;
        }
      }
      iVar1 = iVar1 + 1;
      lVar7 = lVar7 + 1;
      lVar6 = lVar6 + 0x18;
    } while (lVar6 != 0x380);
  }
  return 0;
}

Assistant:

static RK_S32 mpp_av1_global_motion_params(AV1Context *ctx, BitReadCtx_t *gb,
                                           AV1RawFrameHeader *current)
{
    RK_S32 ref, type;
    RK_S32 err;

    if (current->frame_type == AV1_FRAME_KEY ||
        current->frame_type == AV1_FRAME_INTRA_ONLY)
        return 0;

    for (ref = AV1_REF_FRAME_LAST; ref <= AV1_REF_FRAME_ALTREF; ref++) {
        flags(is_global[ref], 1, ref);
        if (current->is_global[ref]) {
            flags(is_rot_zoom[ref], 1, ref);
            if (current->is_rot_zoom[ref]) {
                type = AV1_WARP_MODEL_ROTZOOM;
            } else {
                flags(is_translation[ref], 1, ref);
                type = current->is_translation[ref] ? AV1_WARP_MODEL_TRANSLATION
                       : AV1_WARP_MODEL_AFFINE;
            }
        } else {
            type = AV1_WARP_MODEL_IDENTITY;
        }

        if (type >= AV1_WARP_MODEL_ROTZOOM) {
            CHECK(mpp_av1_global_motion_param(ctx, gb, current, type, ref, 2));
            CHECK(mpp_av1_global_motion_param(ctx, gb, current, type, ref, 3));
            if (type == AV1_WARP_MODEL_AFFINE) {
                CHECK(mpp_av1_global_motion_param(ctx, gb, current, type, ref, 4));
                CHECK(mpp_av1_global_motion_param(ctx, gb, current, type, ref, 5));
            } else {
                current->gm_params[ref][4] =  -current->gm_params[ref][3];
                current->gm_params[ref][5] =   current->gm_params[ref][2];
            }
        }
        if (type >= AV1_WARP_MODEL_TRANSLATION) {
            CHECK(mpp_av1_global_motion_param(ctx, gb, current, type, ref, 0));
            CHECK(mpp_av1_global_motion_param(ctx, gb, current, type, ref, 1));
        }
    }

    return 0;
}